

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptBlock.cpp
# Opt level: O1

void __thiscall ScriptBlock::~ScriptBlock(ScriptBlock *this)

{
  LocalFunction *this_00;
  ulong uVar1;
  
  (this->super_ICommand)._vptr_ICommand = (_func_int **)&PTR_execute_0010b8e0;
  if (this->commandsCount != 0) {
    uVar1 = 0;
    do {
      if (this->commands[uVar1] != (ICommand *)0x0) {
        operator_delete(this->commands[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->commandsCount);
  }
  if (this->commands != (ICommand **)0x0) {
    operator_delete__(this->commands);
  }
  if (this->isRoot == true) {
    if (this->functionsCount != 0) {
      uVar1 = 0;
      do {
        this_00 = this->functions[uVar1];
        if (this_00 != (LocalFunction *)0x0) {
          LocalFunction::~LocalFunction(this_00);
          operator_delete(this_00);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->functionsCount);
    }
    if (this->functions != (LocalFunction **)0x0) {
      operator_delete__(this->functions);
      return;
    }
  }
  return;
}

Assistant:

ScriptBlock::~ScriptBlock() {
	unsigned int i;
	for (i = 0; i < this->commandsCount; i++) {
		delete this->commands[i];
	}
	delete[] this->commands;
	
	if (this->isRoot) {
		for (i = 0; i < this->functionsCount; i++) {
			delete this->functions[i];
		}
		delete[] this->functions;
	}
}